

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeShape.cpp
# Opt level: O2

btVector3 __thiscall btConeShape::localGetSupportingVertex(btConeShape *this,btVector3 *vec)

{
  float extraout_XMM0_Da;
  btScalar bVar1;
  float extraout_XMM0_Da_00;
  btVector3 bVar2;
  float local_48;
  btScalar bStack_44;
  float local_38;
  float fStack_34;
  btVector3 local_28;
  
  bVar2 = coneLocalSupport(this,vec);
  (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
    _vptr_btCollisionShape[0xc])(this);
  local_38 = bVar2.m_floats[0];
  fStack_34 = bVar2.m_floats[1];
  local_48 = bVar2.m_floats[2];
  bStack_44 = bVar2.m_floats[3];
  if ((extraout_XMM0_Da != 0.0) || (NAN(extraout_XMM0_Da))) {
    local_28.m_floats._0_8_ = *(undefined8 *)vec->m_floats;
    local_28.m_floats._8_8_ = *(undefined8 *)(vec->m_floats + 2);
    bVar1 = btVector3::length2(&local_28);
    if (bVar1 < 1.4210855e-14) {
      local_28.m_floats[0] = -1.0;
      local_28.m_floats[1] = -1.0;
      local_28.m_floats[2] = -1.0;
      local_28.m_floats[3] = 0.0;
    }
    btVector3::normalize(&local_28);
    (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
      _vptr_btCollisionShape[0xc])(this);
    local_38 = local_38 + extraout_XMM0_Da_00 * local_28.m_floats[0];
    fStack_34 = fStack_34 + extraout_XMM0_Da_00 * local_28.m_floats[1];
    local_48 = local_48 + local_28.m_floats[2] * extraout_XMM0_Da_00;
  }
  bVar2.m_floats[1] = fStack_34;
  bVar2.m_floats[0] = local_38;
  bVar2.m_floats[3] = bStack_44;
  bVar2.m_floats[2] = local_48;
  return (btVector3)bVar2.m_floats;
}

Assistant:

btVector3	btConeShape::localGetSupportingVertex(const btVector3& vec)  const
{
	btVector3 supVertex = coneLocalSupport(vec);
	if ( getMargin()!=btScalar(0.) )
	{
		btVector3 vecnorm = vec;
		if (vecnorm .length2() < (SIMD_EPSILON*SIMD_EPSILON))
		{
			vecnorm.setValue(btScalar(-1.),btScalar(-1.),btScalar(-1.));
		} 
		vecnorm.normalize();
		supVertex+= getMargin() * vecnorm;
	}
	return supVertex;
}